

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O2

void __thiscall cornelich::excerpt_appender::finish(excerpt_appender *this)

{
  region_ptr *this_00;
  element_type *peVar1;
  void *pvVar2;
  region *prVar3;
  int iVar4;
  logic_error *this_01;
  uint8_t *index_value;
  int64_t position;
  pair<std::shared_ptr<cornelich::region>,_long> local_48;
  int64_t *local_30;
  region_ptr *local_28;
  
  if (this->m_finished == true) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"Not started");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  peVar1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    return;
  }
  pvVar2 = (peVar1->m_region).m_base;
  *(int32_t *)((long)pvVar2 + (long)((*(int *)&(this->m_buffer).m_data - (int)pvVar2) + -4)) =
       ~(this->m_buffer).m_position;
  peVar1 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  index_value = (this->m_buffer).m_data +
                ((long)this->m_last_thread_id <<
                (-(char)(this->m_chronicle->m_settings).m_thread_id_bits & 0x3fU)) +
                ((long)peVar1->m_index * (this->m_chronicle->m_settings).m_data_block_size -
                (long)(peVar1->m_region).m_base);
  this_00 = &this->m_index_region;
  prVar3 = (this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (prVar3 == (region *)0x0) {
    position = -1;
  }
  else {
    position = vanilla_index::append(prVar3,(int64_t)index_value);
    peVar1 = (this_00->super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (-1 < position) {
      iVar4 = peVar1->m_index;
      goto LAB_0016e36d;
    }
    if (peVar1 != (element_type *)0x0) {
      this->m_last_index_file_number = peVar1->m_index + 1;
      std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this_00->super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  vanilla_index::append
            (&local_48,&this->m_chronicle->m_index,this->m_last_cycle,(int64_t)index_value,
             this->m_last_index_file_number);
  local_30 = &position;
  local_28 = this_00;
  std::tuple<std::shared_ptr<cornelich::region>&,long&>::operator=
            ((tuple<std::shared_ptr<cornelich::region>&,long&> *)&local_30,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.first.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  iVar4 = ((this->m_index_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->m_index;
  this->m_last_index_file_number = iVar4;
LAB_0016e36d:
  set_last_written_index(this,(long)this->m_last_cycle,(long)iVar4,position);
  prVar3 = (this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this->m_index = this->m_last_written_index + 1;
  region::position(prVar3,((prVar3->m_position_offset).super___atomic_base<int>._M_i -
                          prVar3->m_start_offset) + (this->m_buffer).m_position + 4);
  region::align_position
            ((this->m_data_region).super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,4);
  this->m_finished = true;
  return;
}

Assistant:

void excerpt_appender::finish()
{
    if(m_finished)
        throw std::logic_error("Not started");

    if(!m_data_region)
        return;

    const auto length = ~static_cast<std::int32_t>(m_buffer.position());

    m_data_region->write_ordered32(static_cast<std::int32_t>(m_buffer.data() - m_data_region->data() - 4), length);

    const auto data_offset = m_data_region->index() * m_chronicle.m_settings.data_block_size() + (m_buffer.data() - m_data_region->data());
    const auto index_value = (static_cast<std::int64_t>(m_last_thread_id) << m_chronicle.m_settings.index_data_offset_bits()) + data_offset;

    auto position = m_index_region ? vanilla_index::append(*m_index_region, index_value) : -1;
    if (position < 0)
    {
        if (m_index_region)
        {
            m_last_index_file_number = static_cast<std::int32_t>(m_index_region->index()) + 1;
            m_index_region.reset();
        }

        std::tie(m_index_region, position) = m_chronicle.m_index.append(m_last_cycle, index_value, m_last_index_file_number);
        m_last_index_file_number = m_index_region->index();
    }

    set_last_written_index(m_last_cycle, m_index_region->index(), position);

    m_index = m_last_written_index + 1;
    m_data_region->position(m_data_region->position() + m_buffer.position() + 4);
    m_data_region->align_position(4);
    m_finished = true;
}